

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void * ImFileLoadToMemory(char *filename,char *file_open_mode,size_t *out_file_size,
                         int padding_bytes)

{
  int *piVar1;
  int iVar2;
  FILE *__stream;
  size_t __n;
  void *__ptr;
  size_t sVar3;
  
  if ((filename == (char *)0x0) || (file_open_mode == (char *)0x0)) {
    __assert_fail("filename && file_open_mode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x63c,"void *ImFileLoadToMemory(const char *, const char *, size_t *, int)");
  }
  if (out_file_size != (size_t *)0x0) {
    *out_file_size = 0;
  }
  __stream = fopen(filename,file_open_mode);
  if (__stream != (FILE *)0x0) {
    iVar2 = fseek(__stream,0,2);
    if (((iVar2 == 0) && (__n = ftell(__stream), __n != 0xffffffffffffffff)) &&
       (iVar2 = fseek(__stream,0,0), iVar2 == 0)) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __ptr = (*GImAllocatorAllocFunc)(__n + (long)padding_bytes,GImAllocatorUserData);
      if (__ptr != (void *)0x0) {
        sVar3 = fread(__ptr,1,__n,__stream);
        if (sVar3 != __n) {
          fclose(__stream);
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(__ptr,GImAllocatorUserData);
          return (void *)0x0;
        }
        if (0 < padding_bytes) {
          memset((void *)((long)__ptr + __n),0,(long)padding_bytes);
        }
        fclose(__stream);
        if (out_file_size != (size_t *)0x0) {
          *out_file_size = __n;
          return __ptr;
        }
        return __ptr;
      }
    }
    fclose(__stream);
  }
  return (void *)0x0;
}

Assistant:

void* ImFileLoadToMemory(const char* filename, const char* file_open_mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && file_open_mode);
    if (out_file_size)
        *out_file_size = 0;

    FILE* f;
    if ((f = ImFileOpen(filename, file_open_mode)) == NULL)
        return NULL;

    long file_size_signed;
    if (fseek(f, 0, SEEK_END) || (file_size_signed = ftell(f)) == -1 || fseek(f, 0, SEEK_SET))
    {
        fclose(f);
        return NULL;
    }

    size_t file_size = (size_t)file_size_signed;
    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        fclose(f);
        return NULL;
    }
    if (fread(file_data, 1, file_size, f) != file_size)
    {
        fclose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    fclose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}